

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O3

wchar_t lookup_curse(char *name)

{
  byte bVar1;
  int iVar2;
  char **ppcVar3;
  ulong uVar4;
  
  bVar1 = z_info->curse_max;
  if (1 < (ulong)bVar1) {
    ppcVar3 = &curses[1].name;
    uVar4 = 1;
    do {
      if ((*ppcVar3 != (char *)0x0) && (iVar2 = strcmp(name,*ppcVar3), iVar2 == 0)) {
        return (wchar_t)uVar4;
      }
      uVar4 = uVar4 + 1;
      ppcVar3 = ppcVar3 + 7;
    } while (bVar1 != uVar4);
  }
  return L'\0';
}

Assistant:

int lookup_curse(const char *name)
{
	int i;

	for (i = 1; i < z_info->curse_max; i++) {
		struct curse *curse = &curses[i];
		if (curse->name && streq(name, curse->name))
			return i;
	}
	return 0;
}